

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report_gl_error.h
# Opt level: O2

GLenum igl::opengl::report_gl_error(string *id)

{
  pointer pcVar1;
  FILE *__stream;
  GLenum errorCode;
  char *pcVar2;
  anon_class_1_0_00000001 gluErrorString;
  anon_class_1_0_00000001 local_19;
  
  errorCode = (*glad_glGetError)();
  __stream = _stderr;
  if (errorCode != 0) {
    pcVar1 = (id->_M_dataplus)._M_p;
    pcVar2 = report_gl_error::anon_class_1_0_00000001::operator()(&local_19,errorCode);
    fprintf(__stream,"GL_ERROR: %s%s\n",pcVar1,pcVar2);
  }
  return errorCode;
}

Assistant:

IGL_INLINE GLenum igl::opengl::report_gl_error(const std::string id)
{
  // http://stackoverflow.com/q/28485180/148668

  // gluErrorString was deprecated
  const auto gluErrorString = [](GLenum errorCode)->const char *
  {
    switch(errorCode)
    {
      default:
        return "unknown error code";
      case GL_NO_ERROR:
        return "no error";
      case GL_INVALID_ENUM:
        return "invalid enumerant";
      case GL_INVALID_VALUE:
        return "invalid value";
      case GL_INVALID_OPERATION:
        return "invalid operation";
#ifndef GL_VERSION_3_0
      case GL_STACK_OVERFLOW:
        return "stack overflow";
      case GL_STACK_UNDERFLOW:
        return "stack underflow";
      case GL_TABLE_TOO_LARGE:
        return "table too large";
#endif
      case GL_OUT_OF_MEMORY:
        return "out of memory";
#ifdef GL_EXT_framebuffer_object
      case GL_INVALID_FRAMEBUFFER_OPERATION_EXT:
        return "invalid framebuffer operation";
#endif
    }
  };

  GLenum err = glGetError();
  if(GL_NO_ERROR != err)
  {
    fprintf(stderr,"GL_ERROR: %s%s\n",id.c_str(),gluErrorString(err));
  }
  return err;
}